

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

string * HelpMessageOpt(string *option,string *message)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  allocator<char> *in_stack_fffffffffffffe50;
  allocator<char> *__a;
  undefined8 in_stack_fffffffffffffe58;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 in_stack_fffffffffffffe78 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  allocator<char> local_14c;
  allocator<char> local_14b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14a [3];
  size_t in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  string_view in_stack_ffffffffffffff48;
  
  __c = (char)((ulong)in_stack_fffffffffffffe58 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)&local_14a[0]._M_dataplus._M_p + 1);
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(size_type)in_RDI,__c,in_stack_fffffffffffffe50);
  std::__cxx11::string::string(in_stack_fffffffffffffe78._8_8_,in_stack_fffffffffffffe78._0_8_);
  std::operator+(__lhs,this_00);
  this = local_14a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe78._8_8_,
             in_stack_fffffffffffffe78._0_8_);
  std::operator+(__lhs,this_00);
  __a = &local_14b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(size_type)in_RDI,(char)((ulong)this >> 0x38),__a);
  std::operator+(__lhs,this_00);
  _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(this);
  FormatParagraph_abi_cxx11_
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::operator+(__lhs,this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe88,_Var2._M_str,(allocator<char> *)_Var2._M_len);
  std::operator+(__lhs,this_00);
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::allocator<char>::~allocator(&local_14c);
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::allocator<char>::~allocator(&local_14b);
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::allocator<char>::~allocator((allocator<char> *)local_14a);
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::allocator<char>::~allocator((allocator<char> *)((long)&local_14a[0]._M_dataplus._M_p + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

std::string HelpMessageOpt(const std::string &option, const std::string &message) {
    return std::string(optIndent,' ') + std::string(option) +
           std::string("\n") + std::string(msgIndent,' ') +
           FormatParagraph(message, screenWidth - msgIndent, msgIndent) +
           std::string("\n\n");
}